

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es2pTextureUploadTests.cpp
# Opt level: O2

void __thiscall deqp::gles2::Performance::TextureUploadCase::logResults(TextureUploadCase *this)

{
  int *value;
  int *value_00;
  ostringstream *poVar1;
  unsigned_long uVar2;
  int iVar3;
  int iVar4;
  TestLog *pTVar5;
  TestContext *this_00;
  undefined1 auVar6 [16];
  MessageBuilder *pMVar7;
  deUint64 dVar8;
  size_t in_RCX;
  string *psVar9;
  int precision;
  void *__buf;
  void *__buf_00;
  void *__buf_01;
  void *__buf_02;
  void *__buf_03;
  void *__buf_04;
  void *__buf_05;
  void *__buf_06;
  int iVar10;
  int __fd;
  char *pcVar11;
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  allocator<char> local_273;
  allocator<char> local_272;
  allocator<char> local_271;
  string local_270;
  string local_250;
  string local_230;
  float local_210;
  int local_20c;
  double local_208;
  double dStack_200;
  double local_1f8;
  double dStack_1f0;
  vector<unsigned_long,_std::allocator<unsigned_long>_> sortedFrameTimes;
  undefined1 local_1b0 [384];
  
  pTVar5 = this->m_log;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_250,"Measurement details",(allocator<char> *)&local_230);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_270,"Measurement details",(allocator<char> *)&sortedFrameTimes);
  tcu::LogSection::LogSection((LogSection *)local_1b0,&local_250,&local_270);
  tcu::LogSection::write((LogSection *)local_1b0,(int)pTVar5,__buf,in_RCX);
  tcu::LogSection::~LogSection((LogSection *)local_1b0);
  std::__cxx11::string::~string((string *)&local_270);
  std::__cxx11::string::~string((string *)&local_250);
  local_1b0._0_8_ = this->m_log;
  poVar1 = (ostringstream *)(local_1b0 + 8);
  std::__cxx11::ostringstream::ostringstream(poVar1);
  std::operator<<((ostream *)poVar1,"Uploading texture with ");
  pcVar11 = "glTexSubImage2D";
  if (this->m_uploadFunction == UPLOAD_TEXIMAGE2D) {
    pcVar11 = "glTexImage2D";
  }
  std::operator<<((ostream *)poVar1,pcVar11);
  std::operator<<((ostream *)poVar1,".");
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream(poVar1);
  local_1b0._0_8_ = this->m_log;
  poVar1 = (ostringstream *)(local_1b0 + 8);
  std::__cxx11::ostringstream::ostringstream(poVar1);
  std::operator<<((ostream *)poVar1,"Texture size = ");
  value = &this->m_texSize;
  pMVar7 = tcu::MessageBuilder::operator<<((MessageBuilder *)local_1b0,value);
  std::operator<<(&(pMVar7->m_str).super_basic_ostream<char,_std::char_traits<char>_>,"x");
  pMVar7 = tcu::MessageBuilder::operator<<(pMVar7,value);
  std::operator<<(&(pMVar7->m_str).super_basic_ostream<char,_std::char_traits<char>_>,".");
  tcu::MessageBuilder::operator<<(pMVar7,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream(poVar1);
  local_1b0._0_8_ = this->m_log;
  poVar1 = (ostringstream *)(local_1b0 + 8);
  std::__cxx11::ostringstream::ostringstream(poVar1);
  std::operator<<((ostream *)poVar1,"Viewport size = ");
  pMVar7 = tcu::MessageBuilder::operator<<((MessageBuilder *)local_1b0,&VIEWPORT_SIZE);
  std::operator<<(&(pMVar7->m_str).super_basic_ostream<char,_std::char_traits<char>_>,"x");
  pMVar7 = tcu::MessageBuilder::operator<<(pMVar7,&VIEWPORT_SIZE);
  std::operator<<(&(pMVar7->m_str).super_basic_ostream<char,_std::char_traits<char>_>,".");
  tcu::MessageBuilder::operator<<(pMVar7,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream(poVar1);
  local_1b0._0_8_ = this->m_log;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)(local_1b0 + 8));
  value_00 = &(this->m_calibrator).m_measureState.numDrawCalls;
  pMVar7 = tcu::MessageBuilder::operator<<((MessageBuilder *)local_1b0,value_00);
  std::operator<<(&(pMVar7->m_str).super_basic_ostream<char,_std::char_traits<char>_>,
                  " upload calls / iteration");
  tcu::MessageBuilder::operator<<(pMVar7,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)(local_1b0 + 8));
  tcu::TestLog::endSection(this->m_log);
  pTVar5 = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_250,"Results",(allocator<char> *)&local_230);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_270,"Results",(allocator<char> *)&sortedFrameTimes);
  tcu::LogSection::LogSection((LogSection *)local_1b0,&local_250,&local_270);
  __fd = (int)pTVar5;
  tcu::LogSection::write((LogSection *)local_1b0,__fd,__buf_00,in_RCX);
  tcu::LogSection::~LogSection((LogSection *)local_1b0);
  std::__cxx11::string::~string((string *)&local_270);
  std::__cxx11::string::~string((string *)&local_250);
  std::vector<unsigned_long,std::allocator<unsigned_long>>::
  vector<__gnu_cxx::__normal_iterator<unsigned_long_const*,std::vector<unsigned_long,std::allocator<unsigned_long>>>,void>
            ((vector<unsigned_long,std::allocator<unsigned_long>> *)&sortedFrameTimes,
             (__normal_iterator<const_unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
              )(this->m_calibrator).m_measureState.frameTimes.
               super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
               super__Vector_impl_data._M_start,
             (__normal_iterator<const_unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
              )(this->m_calibrator).m_measureState.frameTimes.
               super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
               super__Vector_impl_data._M_finish,(allocator_type *)local_1b0);
  std::
  __sort<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>,__gnu_cxx::__ops::_Iter_less_iter>
            (sortedFrameTimes.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
             _M_impl.super__Vector_impl_data._M_start,
             sortedFrameTimes.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
             _M_impl.super__Vector_impl_data._M_finish);
  auVar6._8_8_ = (long)sortedFrameTimes.
                       super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                       super__Vector_impl_data._M_finish -
                 (long)sortedFrameTimes.
                       super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                       super__Vector_impl_data._M_start >> 0x3f;
  auVar6._0_8_ = (long)sortedFrameTimes.
                       super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                       super__Vector_impl_data._M_finish -
                 (long)sortedFrameTimes.
                       super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                       super__Vector_impl_data._M_start >> 3;
  local_20c = *value * *value * *value_00;
  uVar2 = sortedFrameTimes.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl
          .super__Vector_impl_data._M_start[SUB168(auVar6 / SEXT816(2),0)];
  dVar8 = deqp::gls::MeasureState::getTotalTime(&(this->m_calibrator).m_measureState);
  iVar3 = (this->m_calibrator).m_measureState.numDrawCalls;
  iVar10 = (int)((ulong)((long)(this->m_calibrator).m_measureState.frameTimes.
                               super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                               _M_impl.super__Vector_impl_data._M_finish -
                        (long)(this->m_calibrator).m_measureState.frameTimes.
                              super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                              _M_impl.super__Vector_impl_data._M_start) >> 3);
  iVar4 = this->m_texSize;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_250,"FramesPerSecond",&local_271);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_270,"Frames per second in measurement\t\t",&local_272);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_230,"Frames/s",&local_273);
  local_208 = (double)iVar10;
  auVar12._8_4_ = (int)(dVar8 >> 0x20);
  auVar12._0_8_ = dVar8;
  auVar12._12_4_ = 0x45300000;
  dStack_1f0 = auVar12._8_8_ - 1.9342813113834067e+25;
  local_1f8 = dStack_1f0 + ((double)CONCAT44(0x43300000,(int)dVar8) - 4503599627370496.0);
  psVar9 = &local_230;
  tcu::LogNumber<float>::LogNumber
            ((LogNumber<float> *)local_1b0,&local_250,&local_270,psVar9,QP_KEY_TAG_PERFORMANCE,
             (float)(local_208 / (local_1f8 / 1000000.0)));
  tcu::LogNumber<float>::write((LogNumber<float> *)local_1b0,__fd,__buf_01,(size_t)psVar9);
  tcu::LogNumber<float>::~LogNumber((LogNumber<float> *)local_1b0);
  std::__cxx11::string::~string((string *)&local_230);
  std::__cxx11::string::~string((string *)&local_270);
  std::__cxx11::string::~string((string *)&local_250);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_250,"AverageFrameTime",&local_271);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_270,"Average frame duration in measurement\t",&local_272);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_230,"us",&local_273);
  psVar9 = &local_230;
  tcu::LogNumber<float>::LogNumber
            ((LogNumber<float> *)local_1b0,&local_250,&local_270,psVar9,QP_KEY_TAG_PERFORMANCE,
             (float)(local_1f8 / local_208));
  tcu::LogNumber<float>::write((LogNumber<float> *)local_1b0,__fd,__buf_02,(size_t)psVar9);
  tcu::LogNumber<float>::~LogNumber((LogNumber<float> *)local_1b0);
  std::__cxx11::string::~string((string *)&local_230);
  std::__cxx11::string::~string((string *)&local_270);
  std::__cxx11::string::~string((string *)&local_250);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_250,"AverageTexelPerf",&local_271);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_270,"Average texel upload performance\t\t",&local_272);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_230,"MTex/s",&local_273);
  local_208 = (double)((long)iVar4 * (long)iVar4 * (long)(iVar3 * iVar10));
  local_210 = (float)(local_208 / local_1f8);
  psVar9 = &local_230;
  tcu::LogNumber<float>::LogNumber
            ((LogNumber<float> *)local_1b0,&local_250,&local_270,psVar9,QP_KEY_TAG_PERFORMANCE,
             local_210);
  tcu::LogNumber<float>::write((LogNumber<float> *)local_1b0,__fd,__buf_03,(size_t)psVar9);
  tcu::LogNumber<float>::~LogNumber((LogNumber<float> *)local_1b0);
  std::__cxx11::string::~string((string *)&local_230);
  std::__cxx11::string::~string((string *)&local_270);
  std::__cxx11::string::~string((string *)&local_250);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_250,"AverageTexelTime",&local_271);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_270,"Average texel upload duration\t\t",&local_272);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_230,"ns",&local_273);
  psVar9 = &local_230;
  tcu::LogNumber<float>::LogNumber
            ((LogNumber<float> *)local_1b0,&local_250,&local_270,psVar9,QP_KEY_TAG_PERFORMANCE,
             (float)((local_1f8 * 1000.0) / local_208));
  tcu::LogNumber<float>::write((LogNumber<float> *)local_1b0,__fd,__buf_04,(size_t)psVar9);
  tcu::LogNumber<float>::~LogNumber((LogNumber<float> *)local_1b0);
  std::__cxx11::string::~string((string *)&local_230);
  std::__cxx11::string::~string((string *)&local_270);
  std::__cxx11::string::~string((string *)&local_250);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_250,"MedianTexelPerf",&local_271);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_270,"Median texel upload performance\t\t",&local_272);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_230,"MTex/s",&local_273);
  local_1f8 = (double)local_20c;
  auVar13._0_8_ = (double)CONCAT44(0x43300000,(int)uVar2);
  auVar13._8_4_ = (int)(uVar2 >> 0x20);
  auVar13._12_4_ = 0x45300000;
  dStack_200 = auVar13._8_8_ - 1.9342813113834067e+25;
  local_208 = dStack_200 + (auVar13._0_8_ - 4503599627370496.0);
  psVar9 = &local_230;
  tcu::LogNumber<float>::LogNumber
            ((LogNumber<float> *)local_1b0,&local_250,&local_270,psVar9,QP_KEY_TAG_PERFORMANCE,
             (float)(local_1f8 / local_208));
  tcu::LogNumber<float>::write((LogNumber<float> *)local_1b0,__fd,__buf_05,(size_t)psVar9);
  tcu::LogNumber<float>::~LogNumber((LogNumber<float> *)local_1b0);
  std::__cxx11::string::~string((string *)&local_230);
  std::__cxx11::string::~string((string *)&local_270);
  std::__cxx11::string::~string((string *)&local_250);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_250,"MedianTexelTime",&local_271);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_270,"Median texel upload duration\t\t",&local_272);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_230,"ns",&local_273);
  psVar9 = &local_230;
  tcu::LogNumber<float>::LogNumber
            ((LogNumber<float> *)local_1b0,&local_250,&local_270,psVar9,QP_KEY_TAG_PERFORMANCE,
             (float)((local_208 * 1000.0) / local_1f8));
  tcu::LogNumber<float>::write((LogNumber<float> *)local_1b0,__fd,__buf_06,(size_t)psVar9);
  tcu::LogNumber<float>::~LogNumber((LogNumber<float> *)local_1b0);
  std::__cxx11::string::~string((string *)&local_230);
  std::__cxx11::string::~string((string *)&local_270);
  std::__cxx11::string::~string((string *)&local_250);
  tcu::TestLog::endSection(pTVar5);
  deqp::gls::logCalibrationInfo(pTVar5,&this->m_calibrator);
  this_00 = (this->super_TestCase).super_TestCase.super_TestNode.m_testCtx;
  de::floatToString_abi_cxx11_((string *)local_1b0,(de *)0x2,local_210,precision);
  tcu::TestContext::setTestResult(this_00,QP_TEST_RESULT_PASS,(char *)local_1b0._0_8_);
  std::__cxx11::string::~string((string *)local_1b0);
  std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
            (&sortedFrameTimes.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>);
  return;
}

Assistant:

void TextureUploadCase::logResults (void)
{
	const gls::MeasureState& measureState = m_calibrator.getMeasureState();

	// Log measurement details

	m_log << TestLog::Section("Measurement details", "Measurement details");
	m_log << TestLog::Message << "Uploading texture with " << (m_uploadFunction == UPLOAD_TEXIMAGE2D ? "glTexImage2D" : "glTexSubImage2D") << "." << TestLog::EndMessage; // \todo [arttu] Change enum to struct with name included
	m_log << TestLog::Message << "Texture size = "	<< m_texSize	 << "x" << m_texSize	 << "." << TestLog::EndMessage;
	m_log << TestLog::Message << "Viewport size = " << VIEWPORT_SIZE << "x" << VIEWPORT_SIZE << "." << TestLog::EndMessage;
	m_log << TestLog::Message << measureState.numDrawCalls << " upload calls / iteration" << TestLog::EndMessage;
	m_log << TestLog::EndSection;

	// Log results

	TestLog& log = m_testCtx.getLog();
	log << TestLog::Section("Results", "Results");

	// Log individual frame durations
	//for (int i = 0; i < m_calibrator.measureState.numFrames; i++)
	//	m_log << TestLog::Message	<< "Frame "	<< i+1 << " duration: \t" << m_calibrator.measureState.frameTimes[i] << " us."<< TestLog::EndMessage;

	std::vector<deUint64> sortedFrameTimes(measureState.frameTimes.begin(), measureState.frameTimes.end());
	std::sort(sortedFrameTimes.begin(), sortedFrameTimes.end());
	vector<deUint64>::const_iterator first	= sortedFrameTimes.begin();
	vector<deUint64>::const_iterator last	= sortedFrameTimes.end();
	vector<deUint64>::const_iterator middle	= first + (last - first) / 2;

	deUint64 medianFrameTime			=  *middle;
	double medianMTexelsPerSeconds		= (double)(m_texSize*m_texSize*measureState.numDrawCalls) / (double)medianFrameTime;
	double medianTexelDrawDurationNs	= (double)medianFrameTime * 1000.0 / (double)(m_texSize*m_texSize*measureState.numDrawCalls);

	deUint64	totalTime			= measureState.getTotalTime();
	int			numFrames			= (int)measureState.frameTimes.size();
	deInt64		numTexturesDrawn	= measureState.numDrawCalls * numFrames;
	deInt64		numPixels			= (deInt64)m_texSize * (deInt64)m_texSize * numTexturesDrawn;

	double		framesPerSecond			= (double)numFrames / ((double)totalTime / 1000000.0);
	double		avgFrameTime			= (double)totalTime / (double)numFrames;
	double		avgMTexelsPerSeconds	= (double)numPixels / (double)totalTime;
	double		avgTexelDrawDurationNs	= (double)totalTime * 1000.0 / (double)numPixels;

	log << TestLog::Float("FramesPerSecond",	"Frames per second in measurement\t\t",		"Frames/s",		QP_KEY_TAG_PERFORMANCE,	(float)framesPerSecond);
	log << TestLog::Float("AverageFrameTime",	"Average frame duration in measurement\t",	"us",			QP_KEY_TAG_PERFORMANCE,	(float)avgFrameTime);
	log << TestLog::Float("AverageTexelPerf",	"Average texel upload performance\t\t",		"MTex/s",		QP_KEY_TAG_PERFORMANCE,	(float)avgMTexelsPerSeconds);
	log << TestLog::Float("AverageTexelTime",	"Average texel upload duration\t\t",		"ns",			QP_KEY_TAG_PERFORMANCE,	(float)avgTexelDrawDurationNs);
	log << TestLog::Float("MedianTexelPerf",	"Median texel upload performance\t\t",		"MTex/s",		QP_KEY_TAG_PERFORMANCE,	(float)medianMTexelsPerSeconds);
	log << TestLog::Float("MedianTexelTime",	"Median texel upload duration\t\t",			"ns",			QP_KEY_TAG_PERFORMANCE,	(float)medianTexelDrawDurationNs);

	log << TestLog::EndSection;

	gls::logCalibrationInfo(log, m_calibrator);	// Log calibration details
	m_testCtx.setTestResult(QP_TEST_RESULT_PASS, de::floatToString((float)avgMTexelsPerSeconds, 2).c_str());
}